

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_geometry_device.cpp
# Opt level: O0

void embree::instanceIntersectFuncN(RTCIntersectFunctionNArguments *args)

{
  undefined4 uVar1;
  long lVar2;
  long lVar3;
  undefined8 *in_RDI;
  RTCIntersectArguments iargs;
  uint geomID;
  Ray *ray;
  LazyGeometry *instance;
  RTCRayHitN *rays;
  RTCRayQueryContext *context;
  void *ptr;
  int *valid;
  LazyGeometry *in_stack_ffffffffffffff90;
  
  lVar2 = in_RDI[1];
  lVar3 = in_RDI[4];
  if (*(int *)*in_RDI != 0) {
    if (*(int *)(lVar2 + 8) != 3) {
      lazyCreate(in_stack_ffffffffffffff90);
    }
    uVar1 = *(undefined4 *)(lVar3 + 0x48);
    *(undefined4 *)(lVar3 + 0x48) = 0xffffffff;
    rtcIntersect1(*(undefined8 *)(lVar2 + 0x10),lVar3,&stack0xffffffffffffff90);
    if (*(int *)(lVar3 + 0x48) == -1) {
      *(undefined4 *)(lVar3 + 0x48) = uVar1;
    }
    else {
      *(undefined4 *)(lVar3 + 0x4c) = *(undefined4 *)(lVar2 + 0x18);
    }
  }
  return;
}

Assistant:

void instanceIntersectFuncN(const RTCIntersectFunctionNArguments* args)
{
  const int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  RTCRayQueryContext* context = args->context;
  RTCRayHitN* rays = (RTCRayHitN*)args->rayhit;
  assert(args->N == 1);
  LazyGeometry* instance = (LazyGeometry*)ptr;

  if (!valid[0])
    return;
  
  Ray *ray = (Ray *)rays;
  
  /* create the object if it is not yet created */
  if (instance->state != LAZY_VALID)
    lazyCreate(instance);
  
  /* trace ray inside object */
  const unsigned int geomID = ray->geomID;
  ray->geomID = RTC_INVALID_GEOMETRY_ID;
  RTCIntersectArguments iargs;
  rtcInitIntersectArguments(&iargs);
  iargs.context = context;
  rtcIntersect1(instance->object,RTCRayHit_(*ray),&iargs);
  if (ray->geomID == RTC_INVALID_GEOMETRY_ID) ray->geomID = geomID;
  else ray->instID[0] = instance->userID;
}